

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void()>::callback<std::function<void()>>
          (callback<void_()> *this,function<void_()> *func)

{
  function<void_()> *__x;
  undefined8 in_RSI;
  undefined1 add_ref;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffc4;
  function<void_()> *in_stack_ffffffffffffffc8;
  callable_impl<void,_std::function<void_()>_> *in_stack_ffffffffffffffd0;
  
  add_ref = (undefined1)((ulong)in_RSI >> 0x38);
  __x = (function<void_()> *)operator_new(0x30);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  std::function<void_()>::function
            ((function<void_()> *)CONCAT44(in_stack_ffffffffffffffc4,uVar1),__x);
  callback<void_()>::callable_impl<void,_std::function<void_()>_>::callable_impl
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_()>_> *)
             (CONCAT44(in_stack_ffffffffffffffc4,uVar1) & 0xffffffff00ffffff),
             (callable<void_()> *)__x,(bool)add_ref);
  std::function<void_()>::~function((function<void_()> *)0x36a236);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}